

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.h
# Opt level: O1

bool pybind11::array_t<long,_17>::check_(handle h)

{
  _func_bool_PyObject_ptr_PyObject_ptr *p_Var1;
  PyTypeObject *pPVar2;
  int iVar3;
  handle in_RAX;
  npy_api *pnVar4;
  bool bVar5;
  object local_28;
  
  local_28.super_handle.m_ptr = (handle)(handle)in_RAX.m_ptr;
  pnVar4 = detail::npy_api::get();
  if ((h.m_ptr)->ob_type == pnVar4->PyArray_Type_) {
    bVar5 = true;
  }
  else {
    iVar3 = PyType_IsSubtype();
    bVar5 = iVar3 != 0;
  }
  if (bVar5) {
    p_Var1 = pnVar4->PyArray_EquivTypes_;
    pPVar2 = h.m_ptr[3].ob_type;
    detail::npy_format_descriptor<long,_void>::dtype();
    bVar5 = (*p_Var1)((PyObject *)pPVar2,(PyObject *)local_28.super_handle.m_ptr);
    object::~object(&local_28);
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

static bool check_(handle h) {
        const auto &api = detail::npy_api::get();
        return api.PyArray_Check_(h.ptr())
               && api.PyArray_EquivTypes_(detail::array_proxy(h.ptr())->descr, dtype::of<T>().ptr());
    }